

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

void mpc_input_unmark(mpc_input_t *i)

{
  int iVar1;
  uint uVar2;
  mpc_state_t *pmVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  
  if (0 < i->backtrack) {
    iVar1 = i->marks_num;
    uVar2 = iVar1 - 1;
    i->marks_num = uVar2;
    if ((0x20 < i->marks_slots) &&
       (((iVar1 - ((int)uVar2 >> 0x1f)) + -1 >> 1) + iVar1 + -1 < i->marks_slots)) {
      uVar6 = 0x20;
      if (0x21 < iVar1) {
        uVar6 = (ulong)uVar2;
      }
      i->marks_slots = (int)uVar6;
      pmVar3 = (mpc_state_t *)realloc(i->marks,uVar6 << 5);
      i->marks = pmVar3;
      pcVar4 = (char *)realloc(i->lasts,(long)i->marks_slots);
      i->lasts = pcVar4;
    }
    if ((i->type == 2) && (i->marks_num == 0)) {
      pcVar4 = i->buffer;
      sVar5 = strlen(pcVar4);
      uVar2 = (int)sVar5 - 1;
      if (-1 < (int)uVar2) {
        lVar7 = (ulong)uVar2 + 1;
        do {
          ungetc((int)i->buffer[lVar7 + -1],(FILE *)i->file);
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        pcVar4 = i->buffer;
      }
      free(pcVar4);
      i->buffer = (char *)0x0;
    }
  }
  return;
}

Assistant:

static void mpc_input_unmark(mpc_input_t *i) {
  int j;

  if (i->backtrack < 1) { return; }

  i->marks_num--;

  if (i->marks_slots > i->marks_num + i->marks_num / 2
  &&  i->marks_slots > MPC_INPUT_MARKS_MIN) {
    i->marks_slots =
      i->marks_num > MPC_INPUT_MARKS_MIN ?
      i->marks_num : MPC_INPUT_MARKS_MIN;
    i->marks = realloc(i->marks, sizeof(mpc_state_t) * i->marks_slots);
    i->lasts = realloc(i->lasts, sizeof(char) * i->marks_slots);
  }

  if (i->type == MPC_INPUT_PIPE && i->marks_num == 0) {
    for (j = strlen(i->buffer) - 1; j >= 0; j--)
      ungetc(i->buffer[j], i->file);

    free(i->buffer);
    i->buffer = NULL;
  }

}